

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1b8a13::CAPIExternalCommand::configureAttributeNoContext
          (CAPIExternalCommand *this,StringRef name,StringRef value)

{
  StringRef S;
  CAPIExternalCommand *pCVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  error_code eVar6;
  bool local_1739;
  StringRef local_1700;
  string local_16f0;
  int local_16d0;
  error_category *local_16c8;
  CAPIExternalCommand *local_16c0;
  char *local_16b8;
  undefined1 local_16b0 [8];
  SmallString<4096U> wd;
  CAPIExternalCommand *this_local;
  StringRef value_local;
  StringRef name_local;
  size_t local_460;
  size_t local_458;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_450 [8];
  size_t local_448;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_440 [8];
  size_t local_438;
  size_t local_430;
  size_t local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  CAPIExternalCommand *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  CAPIExternalCommand *local_3d0;
  char *local_3c8;
  char *local_3c0;
  size_t local_3b8;
  char *local_3b0;
  size_t local_3a8;
  size_t local_3a0;
  size_t local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  CAPIExternalCommand *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  CAPIExternalCommand *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  CAPIExternalCommand *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  CAPIExternalCommand *local_2e0;
  char *local_2d8;
  char *local_2d0;
  size_t local_2c8;
  char *local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  char *local_2a0;
  size_t local_298;
  char *local_290;
  size_t local_288;
  char *local_280;
  size_t local_278;
  char **local_270;
  char *local_268;
  size_t local_260;
  size_t *local_258;
  char *local_250;
  size_t local_248;
  CAPIExternalCommand **local_240;
  char *local_238;
  char *local_230;
  CAPIExternalCommand **local_228;
  char *local_220;
  char *local_218;
  CAPIExternalCommand **local_210;
  char *local_208;
  char *local_200;
  CAPIExternalCommand **local_1f8;
  char *local_1f0;
  char *local_1e8;
  size_t *local_1e0;
  char *local_1d8;
  size_t local_1d0;
  CAPIExternalCommand **local_1c8;
  char *local_1c0;
  char *local_1b8;
  CAPIExternalCommand **local_1b0;
  char *local_1a8;
  char *local_1a0;
  size_t *local_198;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_190 [8];
  size_t local_188;
  size_t *local_180;
  char *local_178;
  size_t local_170;
  size_t local_168;
  char *local_160;
  size_t local_158;
  int local_14c;
  size_t local_148;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_140 [8];
  size_t local_138;
  int local_12c;
  char *local_128;
  char *local_120;
  CAPIExternalCommand *local_118;
  int local_10c;
  char *local_108;
  char *local_100;
  CAPIExternalCommand *local_f8;
  int local_ec;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  int local_cc;
  char *local_c8;
  char *local_c0;
  CAPIExternalCommand *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  CAPIExternalCommand *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  CAPIExternalCommand *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  CAPIExternalCommand *local_58;
  int local_4c;
  size_t local_48;
  char *local_40;
  size_t local_38;
  int local_2c;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  value_local.Data = (char *)value.Length;
  this_local = (CAPIExternalCommand *)value.Data;
  sVar3 = name.Length;
  pcVar4 = name.Data;
  value_local.Length = (size_t)pcVar4;
  local_298 = strlen("deps");
  local_290 = "deps";
  local_2a0 = "deps";
  local_268 = "deps";
  local_270 = &local_280;
  local_1739 = false;
  local_288 = local_298;
  local_280 = pcVar4;
  local_278 = sVar3;
  local_260 = local_298;
  if (sVar3 == local_298) {
    local_20 = "deps";
    local_28 = local_298;
    local_18 = pcVar4;
    if (local_298 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(pcVar4,"deps",local_298);
    }
    local_1739 = local_c == 0;
  }
  sVar2 = value_local.Length;
  if (local_1739) {
    llvm::
    SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::clear(&(this->depsPaths).
             super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           );
    llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>
              ((SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths,(StringRef *)&this_local);
  }
  else {
    local_2c8 = strlen("deps-style");
    local_2b0 = sVar2;
    local_2c0 = "deps-style";
    local_2d0 = "deps-style";
    local_250 = "deps-style";
    local_258 = &local_2b0;
    bVar5 = false;
    local_2b8 = local_2c8;
    local_2a8 = sVar3;
    local_248 = local_2c8;
    if (sVar3 == local_2c8) {
      local_38 = sVar2;
      local_40 = "deps-style";
      local_48 = local_2c8;
      if (local_2c8 == 0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp((void *)sVar2,"deps-style",local_2c8);
      }
      bVar5 = local_2c == 0;
    }
    sVar2 = value_local.Length;
    pcVar4 = value_local.Data;
    pCVar1 = this_local;
    if (bVar5) {
      local_2f8 = (char *)strlen("unused");
      local_2e0 = pCVar1;
      local_2d8 = pcVar4;
      local_2f0 = "unused";
      local_300 = "unused";
      local_238 = "unused";
      local_240 = &local_2e0;
      bVar5 = false;
      local_2e8 = local_2f8;
      local_230 = local_2f8;
      if (pcVar4 == local_2f8) {
        local_58 = pCVar1;
        local_60 = "unused";
        local_68 = local_2f8;
        if (local_2f8 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(pCVar1,"unused",(size_t)local_2f8);
        }
        bVar5 = local_4c == 0;
      }
      pcVar4 = value_local.Data;
      pCVar1 = this_local;
      if (bVar5) {
        this->depsFormat = llb_buildsystem_dependency_data_format_unused;
      }
      else {
        local_328 = (char *)strlen("makefile");
        local_310 = pCVar1;
        local_308 = pcVar4;
        local_320 = "makefile";
        local_330 = "makefile";
        local_220 = "makefile";
        local_228 = &local_310;
        bVar5 = false;
        local_318 = local_328;
        local_218 = local_328;
        if (pcVar4 == local_328) {
          local_78 = pCVar1;
          local_80 = "makefile";
          local_88 = local_328;
          if (local_328 == (char *)0x0) {
            local_6c = 0;
          }
          else {
            local_6c = memcmp(pCVar1,"makefile",(size_t)local_328);
          }
          bVar5 = local_6c == 0;
        }
        pcVar4 = value_local.Data;
        pCVar1 = this_local;
        if (bVar5) {
          this->depsFormat = llb_buildsystem_dependency_data_format_makefile;
        }
        else {
          local_358 = (char *)strlen("dependency-info");
          local_340 = pCVar1;
          local_338 = pcVar4;
          local_350 = "dependency-info";
          local_360 = "dependency-info";
          local_208 = "dependency-info";
          local_210 = &local_340;
          bVar5 = false;
          local_348 = local_358;
          local_200 = local_358;
          if (pcVar4 == local_358) {
            local_98 = pCVar1;
            local_a0 = "dependency-info";
            local_a8 = local_358;
            if (local_358 == (char *)0x0) {
              local_8c = 0;
            }
            else {
              local_8c = memcmp(pCVar1,"dependency-info",(size_t)local_358);
            }
            bVar5 = local_8c == 0;
          }
          pcVar4 = value_local.Data;
          pCVar1 = this_local;
          if (bVar5) {
            this->depsFormat = llb_buildsystem_dependency_data_format_dependencyinfo;
          }
          else {
            local_388 = (char *)strlen("makefile-ignoring-subsequent-outputs");
            local_370 = pCVar1;
            local_368 = pcVar4;
            local_380 = "makefile-ignoring-subsequent-outputs";
            local_390 = "makefile-ignoring-subsequent-outputs";
            local_1f0 = "makefile-ignoring-subsequent-outputs";
            local_1f8 = &local_370;
            bVar5 = false;
            if (pcVar4 == local_388) {
              local_b8 = pCVar1;
              local_c0 = "makefile-ignoring-subsequent-outputs";
              if (local_388 == (char *)0x0) {
                local_ac = 0;
              }
              else {
                local_378 = local_388;
                local_1e8 = local_388;
                local_c8 = local_388;
                local_ac = memcmp(pCVar1,"makefile-ignoring-subsequent-outputs",(size_t)local_388);
              }
              bVar5 = local_ac == 0;
            }
            if (!bVar5) {
              return false;
            }
            this->depsFormat =
                 llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs;
          }
        }
      }
    }
    else {
      local_3b8 = strlen("repair-via-ownership-analysis");
      local_3a0 = sVar2;
      local_3b0 = "repair-via-ownership-analysis";
      local_3c0 = "repair-via-ownership-analysis";
      local_1d8 = "repair-via-ownership-analysis";
      local_1e0 = &local_3a0;
      bVar5 = false;
      local_3a8 = local_3b8;
      local_398 = sVar3;
      local_1d0 = local_3b8;
      if (sVar3 == local_3b8) {
        local_d8 = sVar2;
        local_e0 = "repair-via-ownership-analysis";
        local_e8 = local_3b8;
        if (local_3b8 == 0) {
          local_cc = 0;
        }
        else {
          local_cc = memcmp((void *)sVar2,"repair-via-ownership-analysis",local_3b8);
        }
        bVar5 = local_cc == 0;
      }
      sVar2 = value_local.Length;
      pcVar4 = value_local.Data;
      pCVar1 = this_local;
      if (bVar5) {
        local_3e8 = (char *)strlen("true");
        local_3d0 = pCVar1;
        local_3c8 = pcVar4;
        local_3e0 = "true";
        local_3f0 = "true";
        local_1c0 = "true";
        local_1c8 = &local_3d0;
        bVar5 = false;
        local_3d8 = local_3e8;
        local_1b8 = local_3e8;
        if (pcVar4 == local_3e8) {
          local_f8 = pCVar1;
          local_100 = "true";
          local_108 = local_3e8;
          if (local_3e8 == (char *)0x0) {
            local_ec = 0;
          }
          else {
            local_ec = memcmp(pCVar1,"true",(size_t)local_3e8);
          }
          bVar5 = local_ec == 0;
        }
        pcVar4 = value_local.Data;
        pCVar1 = this_local;
        if (!bVar5) {
          local_418 = (char *)strlen("false");
          local_400 = pCVar1;
          local_3f8 = pcVar4;
          local_410 = "false";
          local_420 = "false";
          local_1a8 = "false";
          local_1b0 = &local_400;
          bVar5 = false;
          if (pcVar4 == local_418) {
            local_118 = pCVar1;
            local_120 = "false";
            if (local_418 == (char *)0x0) {
              local_10c = 0;
            }
            else {
              local_408 = local_418;
              local_1a0 = local_418;
              local_128 = local_418;
              local_10c = memcmp(pCVar1,"false",(size_t)local_418);
            }
            bVar5 = local_10c == 0;
          }
          if (!bVar5) {
            return false;
          }
          (this->super_ExternalCommand).super_Command.repairViaOwnershipAnalysis = false;
          return true;
        }
        (this->super_ExternalCommand).super_Command.repairViaOwnershipAnalysis = true;
        return true;
      }
      wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts._4088_8_ =
           anon_var_dwarf_1b54db;
      local_448 = strlen("working-directory");
      local_430 = sVar2;
      local_440[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xff8]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_440[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xff9]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_440[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffa]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_440[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffb]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_440[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffc]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_440[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffd]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_440[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffe]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_440[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xfff]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_450[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xff8]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_450[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xff9]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_450[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffa]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_450[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffb]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_450[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffc]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_450[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffd]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_450[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffe]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_450[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xfff]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_190[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xff8]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_190[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xff9]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_190[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffa]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_190[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffb]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_190[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffc]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_190[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffd]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_190[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xffe]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_190[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts[0xfff]
           .super_AlignedCharArray<1UL,_1UL>.buffer[0];
      local_198 = &local_430;
      bVar5 = false;
      local_438 = local_448;
      local_428 = sVar3;
      local_188 = local_448;
      if (sVar3 == local_448) {
        local_138 = sVar2;
        local_140[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             [0xff8].super_AlignedCharArray<1UL,_1UL>.buffer[0];
        local_140[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             [0xff9].super_AlignedCharArray<1UL,_1UL>.buffer[0];
        local_140[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             [0xffa].super_AlignedCharArray<1UL,_1UL>.buffer[0];
        local_140[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             [0xffb].super_AlignedCharArray<1UL,_1UL>.buffer[0];
        local_140[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             [0xffc].super_AlignedCharArray<1UL,_1UL>.buffer[0];
        local_140[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             [0xffd].super_AlignedCharArray<1UL,_1UL>.buffer[0];
        local_140[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             [0xffe].super_AlignedCharArray<1UL,_1UL>.buffer[0];
        local_140[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             [0xfff].super_AlignedCharArray<1UL,_1UL>.buffer[0];
        local_148 = local_448;
        if (local_448 == 0) {
          local_12c = 0;
        }
        else {
          local_12c = memcmp((void *)sVar2,
                             (void *)wd.super_SmallVector<char,_4096U>.
                                     super_SmallVectorStorage<char,_4096U>.InlineElts._4088_8_,
                             local_448);
        }
        bVar5 = local_12c == 0;
      }
      sVar2 = value_local.Length;
      if (bVar5) {
        local_16c0 = this_local;
        local_16b8 = value_local.Data;
        S.Length = (size_t)value_local.Data;
        S.Data = (char *)this_local;
        llvm::SmallString<4096U>::SmallString((SmallString<4096U> *)local_16b0,S);
        eVar6 = llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)local_16b0);
        local_16c8 = eVar6._M_cat;
        local_16d0 = eVar6._M_value;
        local_1700 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_16b0);
        llvm::StringRef::operator_cast_to_string(&local_16f0,&local_1700);
        std::__cxx11::string::operator=((string *)&this->workingDirectory,(string *)&local_16f0);
        std::__cxx11::string::~string((string *)&local_16f0);
        llvm::SmallString<4096U>::~SmallString((SmallString<4096U> *)local_16b0);
      }
      else {
        local_170 = strlen("outputs");
        local_460 = sVar2;
        local_178 = "outputs";
        local_180 = &local_460;
        bVar5 = false;
        local_458 = sVar3;
        if (sVar3 == local_170) {
          local_158 = sVar2;
          local_160 = "outputs";
          local_168 = local_170;
          if (local_170 == 0) {
            local_14c = 0;
          }
          else {
            local_14c = memcmp((void *)sVar2,"outputs",local_170);
          }
          bVar5 = local_14c == 0;
        }
        if (!bVar5) {
          return false;
        }
        llvm::
        SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::clear(&(this->outputNodeNames).
                 super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
        llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>
                  ((SmallVectorImpl<std::__cxx11::string> *)&this->outputNodeNames,
                   (StringRef *)&this_local);
      }
    }
  }
  return true;
}

Assistant:

bool configureAttributeNoContext(StringRef name, StringRef value) {
    if (name == "deps") {
      depsPaths.clear();
      depsPaths.emplace_back(value);
    } else if (name == "deps-style") {
      if (value == "unused") {
        depsFormat = llb_buildsystem_dependency_data_format_unused;
      } else if (value == "makefile") {
        depsFormat = llb_buildsystem_dependency_data_format_makefile;
      } else if (value == "dependency-info") {
        depsFormat = llb_buildsystem_dependency_data_format_dependencyinfo;
      } else if (value == "makefile-ignoring-subsequent-outputs") {
        depsFormat = llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs;
      } else {
        return false;
      }
    } else if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if (value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        return false;
      }
    } else if (name == "working-directory") {
      // Ensure the working directory is absolute. This will make sure any
      // relative directories are interpreted as relative to the CWD at the time
      // the rule is defined.
      SmallString<PATH_MAX> wd = value;
      llvm::sys::fs::make_absolute(wd);
      workingDirectory = StringRef(wd);
    } else if (name == "outputs") {
      outputNodeNames.clear();
      outputNodeNames.emplace_back(value);
    } else {
      return false;
    }
    return true;
  }